

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O1

void RVO::linearProgram3(vector<RVO::Line,_std::allocator<RVO::Line>_> *lines,size_t numObstLines,
                        size_t beginLine,float radius,Vector2 *result)

{
  float fVar1;
  pointer pLVar2;
  Vector2 VVar3;
  pointer pLVar4;
  size_t sVar5;
  ulong uVar6;
  __normal_iterator<const_RVO::Line_*,_std::vector<RVO::Line,_std::allocator<RVO::Line>_>_> __first;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  vector<RVO::Line,_std::allocator<RVO::Line>_> projLines;
  Line local_a8;
  float local_8c;
  vector<RVO::Line,_std::allocator<RVO::Line>_> local_88;
  ulong local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  long local_40;
  long local_38;
  
  __first._M_current =
       (lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
       super__Vector_impl_data._M_start;
  if (beginLine <
      (ulong)((long)(lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)__first._M_current >> 4)) {
    local_38 = numObstLines * 0x10;
    local_40 = local_38 + 0xc;
    fVar11 = 0.0;
    local_8c = radius;
    local_70 = numObstLines;
    do {
      if (fVar11 < (__first._M_current[beginLine].point.y_ - result->y_) *
                   __first._M_current[beginLine].direction.x_ -
                   (__first._M_current[beginLine].point.x_ - result->x_) *
                   __first._M_current[beginLine].direction.y_) {
        std::vector<RVO::Line,std::allocator<RVO::Line>>::
        vector<__gnu_cxx::__normal_iterator<RVO::Line_const*,std::vector<RVO::Line,std::allocator<RVO::Line>>>,void>
                  ((vector<RVO::Line,std::allocator<RVO::Line>> *)&local_88,__first,
                   (Line *)((long)&((__first._M_current)->point).x_ + local_38),
                   (allocator_type *)&local_a8);
        lVar7 = local_40;
        for (uVar6 = local_70; uVar6 < beginLine; uVar6 = uVar6 + 1) {
          local_a8.direction.x_ = 0.0;
          local_a8.direction.y_ = 0.0;
          pLVar2 = (lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pLVar4 = pLVar2 + beginLine;
          fVar11 = pLVar2[beginLine].direction.x_;
          fVar12 = pLVar2[beginLine].direction.y_;
          fVar9 = *(float *)((long)pLVar2 + lVar7 + -4);
          fVar1 = *(float *)((long)&(pLVar2->point).x_ + lVar7);
          fVar13 = fVar11 * fVar1 - fVar9 * fVar12;
          if (ABS(fVar13) <= 1e-05) {
            if (fVar11 * fVar9 + fVar1 * fVar12 <= 0.0) {
              fVar8 = ((pLVar4->point).x_ + *(float *)((long)pLVar2 + lVar7 + -0xc)) * 0.5;
              fVar10 = ((pLVar4->point).y_ + *(float *)((long)pLVar2 + lVar7 + -8)) * 0.5;
              goto LAB_00106a81;
            }
          }
          else {
            fVar8 = (pLVar4->point).x_;
            fVar10 = (pLVar4->point).y_;
            fVar13 = (fVar9 * (fVar10 - *(float *)((long)pLVar2 + lVar7 + -8)) -
                     (fVar8 - *(float *)((long)pLVar2 + lVar7 + -0xc)) * fVar1) / fVar13;
            fVar8 = fVar11 * fVar13 + fVar8;
            fVar10 = fVar12 * fVar13 + fVar10;
LAB_00106a81:
            local_a8.point.y_ = fVar10;
            local_a8.point.x_ = fVar8;
            fVar11 = *(float *)((long)pLVar2 + lVar7 + -4) - (pLVar4->direction).x_;
            fVar12 = *(float *)((long)&(pLVar2->point).x_ + lVar7) - (pLVar4->direction).y_;
            fVar9 = fVar11 * fVar11 + fVar12 * fVar12;
            if (fVar9 < 0.0) {
              local_58 = ZEXT416((uint)fVar11);
              local_68 = ZEXT416((uint)fVar12);
              fVar9 = sqrtf(fVar9);
              fVar11 = (float)local_58._0_4_;
              fVar12 = (float)local_68._0_4_;
            }
            else {
              fVar9 = SQRT(fVar9);
            }
            local_a8.direction.y_ = fVar12 * (1.0 / fVar9);
            local_a8.direction.x_ = fVar11 * (1.0 / fVar9);
            if (local_88.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_88.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<RVO::Line,std::allocator<RVO::Line>>::_M_realloc_insert<RVO::Line_const&>
                        ((vector<RVO::Line,std::allocator<RVO::Line>> *)&local_88,
                         (iterator)
                         local_88.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_a8);
            }
            else {
              (local_88.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
               super__Vector_impl_data._M_finish)->point = local_a8.point;
              (local_88.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
               super__Vector_impl_data._M_finish)->direction = local_a8.direction;
              local_88.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_88.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          lVar7 = lVar7 + 0x10;
        }
        VVar3 = *result;
        pLVar4 = (lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        local_a8.point =
             (Vector2)(CONCAT44(pLVar4[beginLine].direction.x_,pLVar4[beginLine].direction.y_) ^
                      0x80000000);
        sVar5 = linearProgram2(&local_88,local_8c,&local_a8.point,true,result);
        if (sVar5 < (ulong)((long)local_88.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_88.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4)) {
          *result = VVar3;
        }
        pLVar4 = (lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        fVar12 = (pLVar4[beginLine].point.x_ - result->x_) * pLVar4[beginLine].direction.y_;
        fVar11 = (pLVar4[beginLine].point.y_ - result->y_) * pLVar4[beginLine].direction.x_;
        if (local_88.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          local_58._0_4_ = fVar11;
          local_68._0_4_ = fVar12;
          operator_delete(local_88.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl
                          .super__Vector_impl_data._M_start,
                          (long)local_88.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>.
                                _M_impl.super__Vector_impl_data._M_start);
          fVar12 = (float)local_68._0_4_;
          fVar11 = (float)local_58._0_4_;
        }
        fVar11 = fVar11 - fVar12;
      }
      beginLine = beginLine + 1;
      __first._M_current =
           (lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
           super__Vector_impl_data._M_start;
    } while (beginLine <
             (ulong)((long)(lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)__first._M_current >> 4
                    ));
  }
  return;
}

Assistant:

void linearProgram3(const std::vector<Line> &lines, size_t numObstLines, size_t beginLine, float radius, Vector2 &result)
	{
		float distance = 0.0f;

		for (size_t i = beginLine; i < lines.size(); ++i) {
			if (det(lines[i].direction, lines[i].point - result) > distance) {
				/* Result does not satisfy constraint of line i. */
				std::vector<Line> projLines(lines.begin(), lines.begin() + static_cast<ptrdiff_t>(numObstLines));

				for (size_t j = numObstLines; j < i; ++j) {
					Line line;

					float determinant = det(lines[i].direction, lines[j].direction);

					if (std::fabs(determinant) <= RVO_EPSILON) {
						/* Line i and line j are parallel. */
						if (lines[i].direction * lines[j].direction > 0.0f) {
							/* Line i and line j point in the same direction. */
							continue;
						}
						else {
							/* Line i and line j point in opposite direction. */
							line.point = 0.5f * (lines[i].point + lines[j].point);
						}
					}
					else {
						line.point = lines[i].point + (det(lines[j].direction, lines[i].point - lines[j].point) / determinant) * lines[i].direction;
					}

					line.direction = normalize(lines[j].direction - lines[i].direction);
					projLines.push_back(line);
				}

				const Vector2 tempResult = result;

				if (linearProgram2(projLines, radius, Vector2(-lines[i].direction.y(), lines[i].direction.x()), true, result) < projLines.size()) {
					/* This should in principle not happen.  The result is by definition
					 * already in the feasible region of this linear program. If it fails,
					 * it is due to small floating point error, and the current result is
					 * kept.
					 */
					result = tempResult;
				}

				distance = det(lines[i].direction, lines[i].point - result);
			}
		}
	}